

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

void __thiscall google::protobuf::DynamicMessage::~DynamicMessage(DynamicMessage *this)

{
  Descriptor *this_00;
  string *this_01;
  double *pdVar1;
  bool bVar2;
  int iVar3;
  CppType CVar4;
  UnknownFieldSet *this_02;
  ExtensionSet *this_03;
  FieldDescriptor *this_04;
  int *piVar5;
  RepeatedField<double> *this_05;
  FieldOptions *pFVar6;
  string *psVar7;
  Message *message;
  string *ptr;
  void *field_ptr;
  FieldDescriptor *field;
  int i;
  Descriptor *descriptor;
  DynamicMessage *this_local;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DynamicMessage_00411ba0;
  this_00 = this->type_info_->type;
  this_02 = (UnknownFieldSet *)OffsetToPointer(this,this->type_info_->unknown_fields_offset);
  UnknownFieldSet::~UnknownFieldSet(this_02);
  if (this->type_info_->extensions_offset != -1) {
    this_03 = (ExtensionSet *)OffsetToPointer(this,this->type_info_->extensions_offset);
    internal::ExtensionSet::~ExtensionSet(this_03);
  }
  for (field._4_4_ = 0; iVar3 = Descriptor::field_count(this_00), field._4_4_ < iVar3;
      field._4_4_ = field._4_4_ + 1) {
    this_04 = Descriptor::field(this_00,field._4_4_);
    piVar5 = internal::scoped_array<int>::operator[](&this->type_info_->offsets,(long)field._4_4_);
    this_05 = (RepeatedField<double> *)OffsetToPointer(this,*piVar5);
    bVar2 = FieldDescriptor::is_repeated(this_04);
    if (bVar2) {
      CVar4 = FieldDescriptor::cpp_type(this_04);
      switch(CVar4) {
      case CPPTYPE_INT32:
        RepeatedField<int>::~RepeatedField((RepeatedField<int> *)this_05);
        break;
      case CPPTYPE_INT64:
        RepeatedField<long>::~RepeatedField((RepeatedField<long> *)this_05);
        break;
      case CPPTYPE_UINT32:
        RepeatedField<unsigned_int>::~RepeatedField((RepeatedField<unsigned_int> *)this_05);
        break;
      case CPPTYPE_UINT64:
        RepeatedField<unsigned_long>::~RepeatedField((RepeatedField<unsigned_long> *)this_05);
        break;
      case CPPTYPE_DOUBLE:
        RepeatedField<double>::~RepeatedField(this_05);
        break;
      case CPPTYPE_FLOAT:
        RepeatedField<float>::~RepeatedField((RepeatedField<float> *)this_05);
        break;
      case CPPTYPE_BOOL:
        RepeatedField<bool>::~RepeatedField((RepeatedField<bool> *)this_05);
        break;
      case CPPTYPE_ENUM:
        RepeatedField<int>::~RepeatedField((RepeatedField<int> *)this_05);
        break;
      case CPPTYPE_STRING:
        pFVar6 = FieldDescriptor::options(this_04);
        FieldOptions::ctype(pFVar6);
        RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)this_05);
        break;
      case CPPTYPE_MESSAGE:
        RepeatedPtrField<google::protobuf::Message>::~RepeatedPtrField
                  ((RepeatedPtrField<google::protobuf::Message> *)this_05);
      }
    }
    else {
      CVar4 = FieldDescriptor::cpp_type(this_04);
      if (CVar4 == CPPTYPE_STRING) {
        pFVar6 = FieldDescriptor::options(this_04);
        FieldOptions::ctype(pFVar6);
        this_01 = (string *)this_05->elements_;
        psVar7 = FieldDescriptor::default_value_string_abi_cxx11_(this_04);
        if ((this_01 != psVar7) && (this_01 != (string *)0x0)) {
          std::__cxx11::string::~string((string *)this_01);
          operator_delete(this_01,0x20);
        }
      }
      else {
        CVar4 = FieldDescriptor::cpp_type(this_04);
        if ((((CVar4 == CPPTYPE_MESSAGE) && (bVar2 = is_prototype(this), !bVar2)) &&
            (pdVar1 = this_05->elements_, pdVar1 != (double *)0x0)) && (pdVar1 != (double *)0x0)) {
          (**(code **)((long)*pdVar1 + 8))();
        }
      }
    }
  }
  Message::~Message(&this->super_Message);
  return;
}

Assistant:

DynamicMessage::~DynamicMessage() {
  const Descriptor* descriptor = type_info_->type;

  reinterpret_cast<UnknownFieldSet*>(
    OffsetToPointer(type_info_->unknown_fields_offset))->~UnknownFieldSet();

  if (type_info_->extensions_offset != -1) {
    reinterpret_cast<ExtensionSet*>(
      OffsetToPointer(type_info_->extensions_offset))->~ExtensionSet();
  }

  // We need to manually run the destructors for repeated fields and strings,
  // just as we ran their constructors in the the DynamicMessage constructor.
  // Additionally, if any singular embedded messages have been allocated, we
  // need to delete them, UNLESS we are the prototype message of this type,
  // in which case any embedded messages are other prototypes and shouldn't
  // be touched.
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    void* field_ptr = OffsetToPointer(type_info_->offsets[i]);

    if (field->is_repeated()) {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                                     \
        case FieldDescriptor::CPPTYPE_##UPPERCASE :                           \
          reinterpret_cast<RepeatedField<LOWERCASE>*>(field_ptr)              \
              ->~RepeatedField<LOWERCASE>();                                  \
          break

        HANDLE_TYPE( INT32,  int32);
        HANDLE_TYPE( INT64,  int64);
        HANDLE_TYPE(UINT32, uint32);
        HANDLE_TYPE(UINT64, uint64);
        HANDLE_TYPE(DOUBLE, double);
        HANDLE_TYPE( FLOAT,  float);
        HANDLE_TYPE(  BOOL,   bool);
        HANDLE_TYPE(  ENUM,    int);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING:
              reinterpret_cast<RepeatedPtrField<string>*>(field_ptr)
                  ->~RepeatedPtrField<string>();
              break;
          }
          break;

        case FieldDescriptor::CPPTYPE_MESSAGE:
          reinterpret_cast<RepeatedPtrField<Message>*>(field_ptr)
              ->~RepeatedPtrField<Message>();
          break;
      }

    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
      switch (field->options().ctype()) {
        default:  // TODO(kenton):  Support other string reps.
        case FieldOptions::STRING: {
          string* ptr = *reinterpret_cast<string**>(field_ptr);
          if (ptr != &field->default_value_string()) {
            delete ptr;
          }
          break;
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      if (!is_prototype()) {
        Message* message = *reinterpret_cast<Message**>(field_ptr);
        if (message != NULL) {
          delete message;
        }
      }
    }
  }
}